

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown2Box_Odd_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  int x;
  uint8_t *t;
  uint8_t *s;
  int dst_width_local;
  uint8_t *dst_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_ptr_local;
  
  t = src_ptr + src_stride;
  s = src_ptr;
  dst_local = dst;
  for (x = 0; x < dst_width + -2; x = x + 2) {
    *dst_local = (uint8_t)((int)((uint)*s + (uint)s[1] + (uint)*t + (uint)t[1] + 2) >> 2);
    dst_local[1] = (uint8_t)((int)((uint)s[2] + (uint)s[3] + (uint)t[2] + (uint)t[3] + 2) >> 2);
    dst_local = dst_local + 2;
    s = s + 4;
    t = t + 4;
  }
  if ((dst_width - 1U & 1) != 0) {
    *dst_local = (uint8_t)((int)((uint)*s + (uint)s[1] + (uint)*t + (uint)t[1] + 2) >> 2);
    dst_local = dst_local + 1;
    s = s + 2;
    t = t + 2;
  }
  *dst_local = (uint8_t)((int)((uint)*s + (uint)*t + 1) >> 1);
  return;
}

Assistant:

void ScaleRowDown2Box_Odd_C(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* dst,
                            int dst_width) {
  const uint8_t* s = src_ptr;
  const uint8_t* t = src_ptr + src_stride;
  int x;
  dst_width -= 1;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst[1] = (s[2] + s[3] + t[2] + t[3] + 2) >> 2;
    dst += 2;
    s += 4;
    t += 4;
  }
  if (dst_width & 1) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst += 1;
    s += 2;
    t += 2;
  }
  dst[0] = (s[0] + t[0] + 1) >> 1;
}